

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

int QFileSystemEngine::mkdir(char *__path,__mode_t __mode)

{
  uint uVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  uint uVar5;
  undefined8 uVar6;
  __mode_t __mode_00;
  uint in_register_00000034;
  char *__path_00;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  NativePath local_38;
  long local_20;
  
  uVar6 = CONCAT44(in_register_00000034,__mode);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_38,(QFileSystemEntry *)__path);
  if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
    local_58.context.version = 2;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning(&local_58,"Empty filename passed to function");
  }
  else {
    qVar3 = QByteArray::indexOf(&local_38,'\0',0);
    if (qVar3 == -1) {
      __mode_00 = 0x1ff;
      if ((in_register_00000034 & 1) != 0) {
        uVar1 = (uint)((__mode & 0x4400) != 0) * 0x100;
        uVar5 = uVar1 + 0x80;
        if ((__mode & 0x2200) == 0) {
          uVar5 = uVar1;
        }
        uVar1 = uVar5 + 0x40;
        if ((__mode & 0x1100) == 0) {
          uVar1 = uVar5;
        }
        uVar6 = 0;
        __mode_00 = __mode >> 1 & 0x38 | __mode & 7 | uVar1;
      }
      removeTrailingSlashes(&local_38);
      __path_00 = local_38.d.ptr;
      if (local_38.d.ptr == (char *)0x0) {
        __path_00 = &QByteArray::_empty;
      }
      iVar2 = ::mkdir(__path_00,__mode_00);
      iVar2 = (int)CONCAT71((int7)((ulong)uVar6 >> 8),iVar2 == 0);
      goto LAB_003b7131;
    }
    local_58.context.version = 2;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning(&local_58,"Broken filename passed to function");
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  iVar2 = 0;
LAB_003b7131:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkdir(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    auto result = QT_MKDIR(removeTrailingSlashes(path), mode) == 0;
#if defined(Q_OS_VXWORKS)
    if (result)
        forceRequestedPermissionsOnVxWorks(path, mode);
#endif
    return result;
}